

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

void __thiscall capnp::_::PointerBuilder::setBlob<capnp::Text>(PointerBuilder *this,Reader value)

{
  WirePointer *ref;
  SegmentBuilder *segment;
  WirePointer *pWVar1;
  ulong __n;
  uint uVar2;
  WirePointer *__dest;
  AllocateResult AVar3;
  
  __n = value.super_StringPtr.content.size_ - 1;
  if (0x1ffffffe < __n) {
    WireHelpers::setTextPointer::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)this);
  }
  ref = this->pointer;
  segment = this->segment;
  uVar2 = (int)__n + 8U >> 3;
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    WireHelpers::zeroObject(segment,this->capTable,ref);
  }
  __dest = (WirePointer *)segment->pos;
  if (((long)((long)(segment->super_SegmentReader).ptr.ptr +
             ((segment->super_SegmentReader).ptr.size_ * 8 - (long)__dest)) >> 3 <
       (long)(ulong)uVar2) ||
     (segment->pos = (word *)(__dest + uVar2), __dest == (WirePointer *)0x0)) {
    AVar3 = BuilderArena::allocate((BuilderArena *)(segment->super_SegmentReader).arena,uVar2 + 1);
    pWVar1 = (WirePointer *)AVar3.words;
    (ref->offsetAndKind).value =
         (int)AVar3.words - *(int *)&((AVar3.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U |
         2;
    ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                   ((AVar3.segment)->super_SegmentReader).id.value;
    (pWVar1->offsetAndKind).value = 1;
    __dest = pWVar1 + 1;
  }
  else {
    (ref->offsetAndKind).value = ((uint)((ulong)((long)__dest - (long)ref) >> 1) & 0xfffffffc) - 3;
    pWVar1 = ref;
  }
  (pWVar1->field_1).upper32Bits = (int)__n * 8 + 10;
  if (__n != 0) {
    memcpy(__dest,value.super_StringPtr.content.ptr,__n);
    return;
  }
  return;
}

Assistant:

void PointerBuilder::setBlob<Text>(Text::Reader value) {
  WireHelpers::setTextPointer(pointer, segment, capTable, value);
}